

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::OnAssertExhaustionCommand
          (CommandRunner *this,AssertExhaustionCommand *command)

{
  bool bVar1;
  Enum EVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ActionResult result;
  
  EVar2 = Ok;
  RunAction(&result,this,(command->super_CommandMixin<(wabt::CommandType)10>).super_Command.line,
            &command->action,Quiet);
  if (result.trap.obj_ != (Trap *)0x0) {
    std::__cxx11::string::string((string *)&local_90,(string *)&(result.trap.obj_)->message_);
    bVar1 = std::operator!=(&local_90,"call stack exhausted");
    std::__cxx11::string::_M_dispose();
    if (!bVar1) goto LAB_0011de6c;
  }
  PrintError(this,(command->super_CommandMixin<(wabt::CommandType)10>).super_Command.line,
             "expected trap: \"%s\"",(command->text)._M_dataplus._M_p);
  EVar2 = Error;
LAB_0011de6c:
  ActionResult::~ActionResult(&result);
  return (Result)EVar2;
}

Assistant:

wabt::Result CommandRunner::OnAssertExhaustionCommand(
    const AssertExhaustionCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);
  if (!result.trap || result.trap->message() != "call stack exhausted") {
    PrintError(command->line, "expected trap: \"%s\"", command->text.c_str());
    return wabt::Result::Error;
  }

  // TODO: print message when assertion passes.
#if 0
  PrintError(command->line, "assert_exhaustion passed: %s",
             result.trap->message().c_str());
#endif
  return wabt::Result::Ok;
}